

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STL_set.cpp
# Opt level: O3

void FindPeople(void)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  char cVar6;
  istream *piVar7;
  _Rb_tree_node_base *p_Var8;
  _Link_type __x;
  _Rb_tree_color _Var9;
  _Base_ptr p_Var10;
  long lVar11;
  _Rb_tree_node_base *p_Var12;
  char *pcVar13;
  _Rb_tree_node_base *p_Var14;
  long lVar15;
  int iVar16;
  bool bVar17;
  bool bVar18;
  int age;
  int w;
  int h;
  int m;
  int n;
  set<people,_std::less<people>,_std::allocator<people>_> s;
  undefined1 local_74 [16];
  int local_64 [3];
  _Rb_tree_node_base local_58;
  long local_38;
  
  piVar7 = (istream *)std::istream::operator>>((istream *)&std::cin,local_64);
  __x = (_Link_type)(local_74 + 0xc);
  std::istream::operator>>(piVar7,(int *)__x);
  local_58._M_left = &local_58;
  local_58._M_color = _S_red;
  iVar16 = 0;
  local_58._M_parent = (_Rb_tree_node_base *)0x0;
  local_38 = 0;
  local_58._M_right = local_58._M_left;
  if (0 < local_64[0]) {
    do {
      piVar7 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)(local_74 + 8));
      piVar7 = (istream *)std::istream::operator>>(piVar7,(int *)(local_74 + 4));
      __x = (_Link_type)local_74;
      std::istream::operator>>(piVar7,(int *)__x);
      uVar5 = local_74._8_4_;
      uVar4 = local_74._4_4_;
      uVar3 = local_74._0_4_;
      p_Var10 = local_58._M_parent;
      p_Var12 = &local_58;
      while (p_Var10 != (_Rb_tree_node_base *)0x0) {
        while( true ) {
          p_Var8 = p_Var10;
          _Var9 = p_Var8[1]._M_color;
          bVar18 = SBORROW4(local_74._8_4_,_Var9);
          bVar17 = (int)(local_74._8_4_ - _Var9) < 0;
          if (local_74._8_4_ == _Var9) {
            iVar1 = *(int *)&p_Var8[1].field_0x4;
            bVar18 = SBORROW4(local_74._4_4_,iVar1);
            bVar17 = local_74._4_4_ - iVar1 < 0;
            if (local_74._4_4_ == iVar1) {
              bVar18 = SBORROW4(local_74._0_4_,*(int *)&p_Var8[1]._M_parent);
              bVar17 = local_74._0_4_ - *(int *)&p_Var8[1]._M_parent < 0;
            }
          }
          p_Var12 = p_Var8;
          if (bVar18 != bVar17) break;
          p_Var10 = p_Var8->_M_right;
          if (p_Var8->_M_right == (_Base_ptr)0x0) goto LAB_0010181b;
        }
        p_Var10 = p_Var8->_M_left;
      }
      if (p_Var12 == local_58._M_left) {
LAB_0010182c:
        if (&local_58 == p_Var12) {
          bVar17 = true;
        }
        else {
          _Var9 = p_Var12[1]._M_color;
          bVar18 = SBORROW4(uVar5,_Var9);
          bVar17 = (int)(uVar5 - _Var9) < 0;
          if (uVar5 == _Var9) {
            iVar1 = *(int *)&p_Var12[1].field_0x4;
            bVar18 = SBORROW4(uVar4,iVar1);
            bVar17 = uVar4 - iVar1 < 0;
            if (uVar4 == iVar1) {
              bVar18 = SBORROW4(uVar3,*(int *)&p_Var12[1]._M_parent);
              bVar17 = uVar3 - *(int *)&p_Var12[1]._M_parent < 0;
            }
          }
          bVar17 = bVar18 != bVar17;
        }
        __x = (_Link_type)operator_new(0x30);
        *(undefined4 *)(__x->_M_storage)._M_storage = uVar5;
        *(undefined4 *)((__x->_M_storage)._M_storage + 4) = uVar4;
        *(undefined4 *)((__x->_M_storage)._M_storage + 8) = uVar3;
        std::_Rb_tree_insert_and_rebalance(bVar17,(_Rb_tree_node_base *)__x,p_Var12,&local_58);
        local_38 = local_38 + 1;
      }
      else {
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var12);
        _Var9 = p_Var8[1]._M_color;
LAB_0010181b:
        bVar18 = SBORROW4(_Var9,uVar5);
        bVar17 = (int)(_Var9 - uVar5) < 0;
        if (_Var9 == uVar5) {
          iVar1 = *(int *)&p_Var8[1].field_0x4;
          bVar18 = SBORROW4(iVar1,uVar4);
          bVar17 = iVar1 - uVar4 < 0;
          if (iVar1 == uVar4) {
            bVar18 = SBORROW4(*(int *)&p_Var8[1]._M_parent,uVar3);
            bVar17 = *(int *)&p_Var8[1]._M_parent - uVar3 < 0;
          }
        }
        if (bVar18 != bVar17) goto LAB_0010182c;
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 < local_64[0]);
  }
  if (0 < (int)local_74._12_4_) {
    iVar16 = 0;
    do {
      piVar7 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)(local_74 + 8));
      piVar7 = (istream *)std::istream::operator>>(piVar7,(int *)(local_74 + 4));
      std::istream::operator>>(piVar7,(int *)local_74);
      lVar11 = 2;
      p_Var12 = local_58._M_parent;
      p_Var8 = &local_58;
      if (local_58._M_parent == (_Rb_tree_node_base *)0x0) {
LAB_00101948:
        pcVar13 = "NO";
      }
      else {
        do {
          _Var9 = p_Var12[1]._M_color;
          bVar17 = SBORROW4(_Var9,local_74._8_4_);
          iVar1 = _Var9 - local_74._8_4_;
          p_Var14 = p_Var12;
          if (_Var9 == local_74._8_4_) {
            iVar2 = *(int *)&p_Var12[1].field_0x4;
            bVar17 = SBORROW4(iVar2,local_74._4_4_);
            iVar1 = iVar2 - local_74._4_4_;
            if (iVar2 != local_74._4_4_) goto LAB_0010190f;
            lVar15 = 0x10;
            if (*(int *)&p_Var12[1]._M_parent < (int)local_74._0_4_) goto LAB_0010191a;
          }
          else {
LAB_0010190f:
            lVar15 = 0x10;
            if (bVar17 != iVar1 < 0) {
LAB_0010191a:
              lVar15 = 0x18;
              p_Var14 = p_Var8;
            }
          }
          p_Var12 = *(_Rb_tree_node_base **)((long)&p_Var12->_M_color + lVar15);
          p_Var8 = p_Var14;
        } while (p_Var12 != (_Rb_tree_node_base *)0x0);
        if (p_Var14 == &local_58) goto LAB_00101948;
        _Var9 = p_Var14[1]._M_color;
        bVar17 = SBORROW4(local_74._8_4_,_Var9);
        iVar1 = local_74._8_4_ - _Var9;
        if (local_74._8_4_ == _Var9) {
          iVar2 = *(int *)&p_Var14[1].field_0x4;
          bVar17 = SBORROW4(local_74._4_4_,iVar2);
          iVar1 = local_74._4_4_ - iVar2;
          if (local_74._4_4_ != iVar2) goto LAB_0010194d;
          pcVar13 = "NO";
          if (*(int *)&p_Var14[1]._M_parent <= (int)local_74._0_4_) goto LAB_00101952;
        }
        else {
LAB_0010194d:
          pcVar13 = "NO";
          if (bVar17 == iVar1 < 0) {
LAB_00101952:
            lVar11 = 3;
            pcVar13 = "YES";
          }
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,lVar11);
      cVar6 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      __x = (_Link_type)(ulong)(uint)(int)cVar6;
      std::ostream::put(-0x70);
      std::ostream::flush();
      iVar16 = iVar16 + 1;
    } while (iVar16 < (int)local_74._12_4_);
  }
  std::_Rb_tree<people,_people,_std::_Identity<people>,_std::less<people>,_std::allocator<people>_>
  ::_M_erase((_Rb_tree<people,_people,_std::_Identity<people>,_std::less<people>,_std::allocator<people>_>
              *)local_58._M_parent,__x);
  return;
}

Assistant:

void FindPeople() {
    struct people{
        int h;
        int w;
        int age;
        //自定义构造函数，来代替people.h 等的输入，直接调用people(h,w,age)传入h,w,age
        people(int _h,int _w, int _age)
        {
            h = _h;
            w = _w;
            age = _age;
        }
        //重载 "<"
        bool operator <(const people &rhs) const
        {
            if (h != rhs.h)
                return h < rhs.h;
            if (w != rhs.w)
                return w < rhs.w;
            return age < rhs.age;
        }
    };
    int n,m,h,w,age;
    cin >> n >> m;
    set<people> s;
    for (int i = 0; i < n; ++i) {
        cin >> h >> w >> age;
        s.insert(people(h,w,age));
    }
    for (int j = 0; j < m; ++j) {
        cin >> h >> w >> age;
        if(s.count(people(h,w,age)))
            cout << "YES" << endl;
        else
            cout << "NO" << endl;
    }
}